

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_server.hpp
# Opt level: O3

error_or<int> * __thiscall
pstore::http::send_message<WsServer_Ping_Test::TestBody()::__2,int>
          (error_or<int> *__return_storage_ptr__,http *this,anon_class_8_1_65350a3f sender,int io,
          opcode op,span<const_unsigned_char,__1L> *span)

{
  ulong uVar1;
  ulong *puVar2;
  error_code *peVar3;
  uint *puVar4;
  error_or<int> *peVar5;
  uint uVar6;
  anon_class_8_1_65350a3f sender_00;
  anon_class_8_1_65350a3f sender_01;
  anon_class_8_1_65350a3f sender_02;
  anon_class_8_1_65350a3f sender_03;
  anon_class_8_1_65350a3f sender_04;
  unsigned_short v;
  opcode oVar7;
  undefined4 in_register_00000084;
  error_code eVar8;
  unsigned_long nv;
  error_or<int> local_70;
  error_or<int> local_58;
  ulong local_40 [2];
  ulong *local_30;
  
  v = (unsigned_short)op;
  puVar2 = (ulong *)CONCAT44(in_register_00000084,op);
  uVar6 = (io & 0xfU) << 8;
  uVar1 = *(ulong *)CONCAT44(in_register_00000084,op);
  if ((long)uVar1 < 0x7e) {
    oVar7 = op;
    send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
              (&local_70,this,sender,uVar6 | (uint)uVar1 & 0x7f | 0x8000,v);
    if (local_70.has_error_ == false) {
      puVar4 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_70);
      sender_00.output._4_4_ = 0;
      sender_00.output._0_4_ = *puVar4;
      send<WsServer_Ping_Test::TestBody()::__2,int>
                (__return_storage_ptr__,this,sender_00,op,
                 (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar7));
    }
    else {
      eVar8 = error_or<int>::get_error(&local_70);
      __return_storage_ptr__->has_error_ = true;
      peVar3 = error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>
                         (__return_storage_ptr__);
      peVar3->_M_value = eVar8._M_value;
      peVar3->_M_cat = eVar8._M_cat;
    }
    if (local_70.has_error_ == false) {
      peVar5 = &local_70;
      goto LAB_001430d4;
    }
    peVar5 = &local_70;
    goto LAB_001430c8;
  }
  if (uVar1 < 0x10000) {
    oVar7 = op;
    send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
              (&local_58,this,sender,uVar6 | 0x807e,v);
    if (local_58.has_error_ == false) {
      puVar4 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_58);
      uVar1 = *puVar2;
      if (0xffff < uVar1) {
        assert_failed("size >= 0 && static_cast< std::make_unsigned<std::remove_const<decltype (size)>::type>::type> ( size) <= std::numeric_limits<LengthType>::max ()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/ws_server.hpp"
                      ,0x144);
      }
      sender_03.output._4_4_ = 0;
      sender_03.output._0_4_ = *puVar4;
      send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
                (&local_70,this,sender_03,(uint)uVar1 & 0xffff,(unsigned_short)oVar7);
    }
    else {
      eVar8 = error_or<int>::get_error(&local_58);
      local_70.has_error_ = true;
      peVar3 = error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&local_70);
      peVar3->_M_value = eVar8._M_value;
      peVar3->_M_cat = eVar8._M_cat;
    }
    if (local_70.has_error_ != false) goto LAB_00143062;
    puVar4 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_70);
    sender_04.output._4_4_ = 0;
    sender_04.output._0_4_ = *puVar4;
    send<WsServer_Ping_Test::TestBody()::__2,int>
              (__return_storage_ptr__,this,sender_04,op,
               (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar7));
  }
  else {
    oVar7 = op;
    send<WsServer_Ping_Test::TestBody()::__2,int,unsigned_short,void>
              (&local_58,this,sender,uVar6 | 0x807f,v);
    if (local_58.has_error_ == false) {
      puVar4 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_58);
      uVar1 = *puVar2;
      if ((long)uVar1 < 0) {
        assert_failed("size >= 0 && static_cast< std::make_unsigned<std::remove_const<decltype (size)>::type>::type> ( size) <= std::numeric_limits<LengthType>::max ()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/ws_server.hpp"
                      ,0x144);
      }
      sender_01.output._4_4_ = 0;
      sender_01.output._0_4_ = *puVar4;
      local_40[0] = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                    (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                    (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                    (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      local_30 = local_40;
      local_40[1] = 8;
      send<WsServer_Ping_Test::TestBody()::__2,int>
                (&local_70,this,sender_01,(int)(local_40 + 1),
                 (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar7));
    }
    else {
      eVar8 = error_or<int>::get_error(&local_58);
      local_70.has_error_ = true;
      peVar3 = error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&local_70);
      peVar3->_M_value = eVar8._M_value;
      peVar3->_M_cat = eVar8._M_cat;
    }
    if (local_70.has_error_ == false) {
      puVar4 = (uint *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_70);
      sender_02.output._4_4_ = 0;
      sender_02.output._0_4_ = *puVar4;
      send<WsServer_Ping_Test::TestBody()::__2,int>
                (__return_storage_ptr__,this,sender_02,op,
                 (span<const_unsigned_char,__1L> *)CONCAT44(in_register_00000084,oVar7));
    }
    else {
LAB_00143062:
      eVar8 = error_or<int>::get_error(&local_70);
      __return_storage_ptr__->has_error_ = true;
      peVar3 = error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>
                         (__return_storage_ptr__);
      peVar3->_M_value = eVar8._M_value;
      peVar3->_M_cat = eVar8._M_cat;
    }
  }
  if (local_70.has_error_ == false) {
    error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(&local_70);
  }
  else {
    error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(&local_70);
  }
  if (local_58.has_error_ == false) {
    peVar5 = &local_58;
LAB_001430d4:
    peVar5 = (error_or<int> *)error_or<int>::value_storage_impl<pstore::error_or<int>&,int>(peVar5);
    return peVar5;
  }
  peVar5 = &local_58;
LAB_001430c8:
  peVar5 = (error_or<int> *)
           error_or<int>::error_storage_impl<pstore::error_or<int>&,std::error_code>(peVar5);
  return peVar5;
}

Assistant:

error_or<IO> send_message (Sender const sender, IO const io, opcode const op,
                                   gsl::span<std::uint8_t const> const & span) {
            frame_fixed_layout f{};
            f.fin = true;
            f.rsv = std::uint16_t{0};
            f.opcode = static_cast<std::uint16_t> (op);
            f.mask = false;

            auto const length = span.size ();
            if (length < 126) {
                f.payload_length = static_cast<std::uint16_t> (length);
                return send (sender, io, f.raw) >>=
                       [sender, &span] (IO io2) { return send (sender, io2, span); };
            }

            if (length <= std::numeric_limits<std::uint16_t>::max ()) {
                // Length is sent as 16-bits.
                f.payload_length = std::uint16_t{126};
                return details::send_extended_length_message<std::uint16_t> (sender, io, f, span);
            }

            // The payload length must not have the top bit set.
            if (static_cast<std::uint64_t> (length) & (std::uint64_t{1} << 63U)) {
                return error_or<IO>{make_error_code (ws_error::message_too_long)};
            }

            // Send the length as a full 64-bit value.
            f.payload_length = std::uint16_t{127};
            return details::send_extended_length_message<std::uint64_t> (sender, io, f, span);
        }